

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmTarget *dependee,bool linking)

{
  bool bVar1;
  TargetType TVar2;
  pointer pcVar3;
  pointer ppVar4;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  cmGraphEdge local_74;
  int local_6c;
  iterator iStack_68;
  int dependee_index;
  _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_int>_> local_60;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_int>_> local_50;
  const_iterator tii;
  cmTarget *transitive_dependee;
  _Self local_38;
  const_iterator i;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *utils;
  cmTarget *pcStack_20;
  bool linking_local;
  cmTarget *dependee_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  pcStack_20 = dependee;
  dependee_local._4_4_ = depender_index;
  pcStack_10 = this;
  bVar1 = cmTarget::IsImported(dependee);
  if ((bVar1) || (TVar2 = cmTarget::GetType(pcStack_20), TVar2 == INTERFACE_LIBRARY)) {
    i._M_node = (_Base_ptr)cmTarget::GetUtilityItems(pcStack_20);
    local_38._M_node =
         (_Base_ptr)
         std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                   ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)i._M_node
                   );
    while( true ) {
      transitive_dependee =
           (cmTarget *)
           std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end
                     ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                      i._M_node);
      bVar1 = std::operator!=(&local_38,(_Self *)&transitive_dependee);
      if (!bVar1) break;
      pcVar3 = std::_Rb_tree_const_iterator<cmLinkItem>::operator->(&local_38);
      tii._M_node = (_Base_ptr)pcVar3->Target;
      if ((cmTarget *)tii._M_node != (cmTarget *)0x0) {
        AddTargetDepend(this,dependee_local._4_4_,(cmTarget *)tii._M_node,false);
      }
      std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&local_38);
    }
  }
  else {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<const_cmTarget_*,_int,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
         ::find(&this->TargetIndex,&stack0xffffffffffffffe0);
    std::_Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_int>_>::_Rb_tree_const_iterator
              (&local_50,&local_58);
    iStack_68 = std::
                map<const_cmTarget_*,_int,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
                ::end(&this->TargetIndex);
    std::_Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_int>_>::_Rb_tree_const_iterator
              (&local_60,&stack0xffffffffffffff98);
    bVar1 = std::operator!=(&local_50,&local_60);
    if (!bVar1) {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmComputeTargetDepends.cxx"
                    ,0x1b9,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmTarget *, bool)");
    }
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_int>_>::operator->
                       (&local_50);
    local_6c = ppVar4->second;
    this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&(this->InitialGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (long)dependee_local._4_4_)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    cmGraphEdge::cmGraphEdge(&local_74,local_6c,(bool)((linking ^ 0xffU) & 1));
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(this_00,&local_74);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmTarget const* dependee,
                                             bool linking)
{
  if(dependee->IsImported() ||
     dependee->GetType() == cmTarget::INTERFACE_LIBRARY)
    {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for(std::set<cmLinkItem>::const_iterator i = utils.begin();
        i != utils.end(); ++i)
      {
      if(cmTarget const* transitive_dependee = i->Target)
        {
        this->AddTargetDepend(depender_index, transitive_dependee, false);
        }
      }
    }
  else
    {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].push_back(
      cmGraphEdge(dependee_index, !linking));
    }
}